

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

char * strnodetype(LYS_NODE type)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar2 = (char *)0x0;
  pcVar1 = (char *)0x0;
  if ((int)type < 0x200) {
    if ((int)type < 0x20) {
      pcVar1 = pcVar2;
      switch(type) {
      case LYS_CONTAINER:
        pcVar1 = "container";
        break;
      case LYS_CHOICE:
        pcVar1 = "choice";
        break;
      case LYS_CHOICE|LYS_CONTAINER:
      case LYS_LEAF|LYS_CONTAINER:
      case LYS_LEAF|LYS_CHOICE:
      case LYS_LEAF|LYS_CHOICE|LYS_CONTAINER:
        break;
      case LYS_LEAF:
        pcVar1 = "leaf";
        break;
      case LYS_LEAFLIST:
        pcVar1 = "leaf-list";
        break;
      default:
        if (type == LYS_LIST) {
          pcVar1 = "list";
        }
      }
    }
    else if ((int)type < 0x80) {
      if (type == LYS_ANYXML) {
        pcVar1 = "anyxml";
      }
      else {
        pcVar1 = pcVar2;
        if (type == LYS_CASE) {
          pcVar1 = "case";
        }
      }
    }
    else if (type == LYS_NOTIF) {
      pcVar1 = "notification";
    }
    else if (type == LYS_RPC) {
      pcVar1 = "rpc";
    }
  }
  else if ((int)type < 0x2000) {
    if ((int)type < 0x800) {
      if (type == LYS_INPUT) {
        pcVar1 = "input";
      }
      else if (type == LYS_OUTPUT) {
        pcVar1 = "output";
      }
    }
    else if (type == LYS_GROUPING) {
      pcVar1 = "grouping";
    }
    else if (type == LYS_USES) {
      pcVar1 = "uses";
    }
  }
  else if ((int)type < 0x8020) {
    if (type == LYS_AUGMENT) {
      pcVar1 = "augment";
    }
    else if (type == LYS_ACTION) {
      pcVar1 = "action";
    }
  }
  else if (type == LYS_ANYDATA) {
    pcVar1 = "anydata";
  }
  else if (type == LYS_EXT) {
    pcVar1 = "extension instance";
  }
  return pcVar1;
}

Assistant:

const char *
strnodetype(LYS_NODE type)
{
    switch (type) {
    case LYS_UNKNOWN:
        return NULL;
    case LYS_AUGMENT:
        return "augment";
    case LYS_CONTAINER:
        return "container";
    case LYS_CHOICE:
        return "choice";
    case LYS_LEAF:
        return "leaf";
    case LYS_LEAFLIST:
        return "leaf-list";
    case LYS_LIST:
        return "list";
    case LYS_ANYXML:
        return "anyxml";
    case LYS_GROUPING:
        return "grouping";
    case LYS_CASE:
        return "case";
    case LYS_INPUT:
        return "input";
    case LYS_OUTPUT:
        return "output";
    case LYS_NOTIF:
        return "notification";
    case LYS_RPC:
        return "rpc";
    case LYS_USES:
        return "uses";
    case LYS_ACTION:
        return "action";
    case LYS_ANYDATA:
        return "anydata";
    case LYS_EXT:
        return "extension instance";
    }

    return NULL;
}